

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

void __thiscall ncnn::Yolov3DetectionOutput::Yolov3DetectionOutput(Yolov3DetectionOutput *this)

{
  undefined8 *in_RDI;
  ParamDict pd;
  Layer *in_stack_fffffffffffffa30;
  Mat *this_00;
  ParamDict *in_stack_fffffffffffffa70;
  
  Layer::Layer(in_stack_fffffffffffffa30);
  *in_RDI = &PTR__Yolov3DetectionOutput_001bfb78;
  this_00 = (Mat *)(in_RDI + 0x12);
  Mat::Mat(this_00);
  Mat::Mat((Mat *)(in_RDI + 0x1a));
  Mat::Mat((Mat *)(in_RDI + 0x22));
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  ParamDict::ParamDict(in_stack_fffffffffffffa70);
  ParamDict::set((ParamDict *)&stack0xfffffffffffffa48,0,0);
  ParamDict::~ParamDict((ParamDict *)this_00);
  return;
}

Assistant:

Yolov3DetectionOutput::Yolov3DetectionOutput()
{
    one_blob_only = false;
    support_inplace = false;
    
    //softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

    // set param
    ncnn::ParamDict pd;
    pd.set(0, 0);// axis

    //softmax->load_param(pd);
}